

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O2

void __thiscall
deqp::sl::ShaderParser::parseShaderGroup
          (ShaderParser *this,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList)

{
  string *__rhs;
  Token TVar1;
  TestCaseGroup *this_00;
  undefined8 extraout_RAX;
  ShaderParser *this_01;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string description;
  string name;
  
  advanceToken(this,TOKEN_GROUP);
  __rhs = &this->m_curTokenStr;
  std::__cxx11::string::string((string *)&name,(string *)__rhs);
  advanceToken(this);
  this_01 = (ShaderParser *)0x2;
  assumeToken(this,TOKEN_STRING);
  parseStringLiteral_abi_cxx11_(&description,this_01,(__rhs->_M_dataplus)._M_p);
  advanceToken(this,TOKEN_STRING);
  children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    while (TVar1 = this->m_curToken, TVar1 == TOKEN_GROUP) {
      parseShaderGroup(this,&children);
    }
    if (TVar1 != TOKEN_CASE) break;
    parseShaderCase(this,&children);
  }
  if (TVar1 == TOKEN_END) {
    advanceToken(this,TOKEN_END);
    this_00 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (this_00,this->m_testCtx,name._M_dataplus._M_p,description._M_dataplus._M_p,&children)
    ;
    local_80._M_dataplus._M_p = (pointer)this_00;
    std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
              ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)shaderNodeList,
               (TestNode **)&local_80);
    std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
              (&children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&name);
    return;
  }
  std::operator+(&local_80,"unexpected token while parsing shader group: ",__rhs);
  parseError(this,&local_80);
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            (&children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>);
  std::__cxx11::string::~string((string *)&description);
  std::__cxx11::string::~string((string *)&name);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ShaderParser::parseShaderGroup(vector<tcu::TestNode*>& shaderNodeList)
{
	// Parse 'case'.
	PARSE_DBG(("  parseShaderGroup()\n"));
	advanceToken(TOKEN_GROUP);

	// Parse case name.
	string name = m_curTokenStr;
	advanceToken(); // \note [pyry] We don't want to check token type here (for instance to allow "uniform") group.

	// Parse description.
	assumeToken(TOKEN_STRING);
	string description = parseStringLiteral(m_curTokenStr.c_str());
	advanceToken(TOKEN_STRING);

	std::vector<tcu::TestNode*> children;

	// Parse group children.
	for (;;)
	{
		if (m_curToken == TOKEN_END)
			break;
		else if (m_curToken == TOKEN_GROUP)
			parseShaderGroup(children);
		else if (m_curToken == TOKEN_CASE)
			parseShaderCase(children);
		else
			parseError(string("unexpected token while parsing shader group: " + m_curTokenStr));
	}

	advanceToken(TOKEN_END); // group end

	// Create group node.
	tcu::TestCaseGroup* groupNode = new tcu::TestCaseGroup(m_testCtx, name.c_str(), description.c_str(), children);
	shaderNodeList.push_back(groupNode);
}